

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_draw_select(t_radio *x,_glist *glist)

{
  _glist *p_Var1;
  char local_b8 [8];
  char tag [128];
  undefined4 local_30;
  int local_2c;
  int col;
  int lcol;
  _glist *canvas;
  int i;
  int n;
  _glist *glist_local;
  t_radio *x_local;
  
  p_Var1 = glist_getcanvas(glist);
  local_2c = (x->x_gui).x_lcol;
  local_30 = 0;
  if (((uint)(x->x_gui).x_fsf >> 0x18 & 1) != 0) {
    local_30 = 0xff;
    local_2c = 0xff;
  }
  sprintf(local_b8,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var1,"itemconfigure",local_b8,"-outline",local_30);
  sprintf(local_b8,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var1,"itemconfigure",local_b8,"-fill",local_2c);
  return;
}

Assistant:

static void radio_draw_select(t_radio* x, t_glist* glist)
{
    int n = x->x_number, i;
    t_canvas *canvas = glist_getcanvas(glist);
    int lcol = x->x_gui.x_lcol;
    int col = IEM_GUI_COLOR_NORMAL;
    char tag[128];

    if(x->x_gui.x_fsf.x_selected)
        lcol = col =  IEM_GUI_COLOR_SELECTED;

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-outline", col);
    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-fill", lcol);
}